

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O2

void xml_print_ns_prefix_data
               (xmlpr_ctx *pctx,LY_VALUE_FORMAT format,void *prefix_data,uint32_t prefix_opts)

{
  undefined8 *puVar1;
  char *new_prefix;
  ulong uVar2;
  
  if (format == LY_VALUE_XML) {
    for (uVar2 = 0; uVar2 < *(uint *)((long)prefix_data + 4); uVar2 = uVar2 + 1) {
      puVar1 = *(undefined8 **)(*(long *)((long)prefix_data + 8) + uVar2 * 8);
      new_prefix = (char *)*puVar1;
      if (new_prefix != (char *)0x0) {
        xml_print_ns(pctx,(char *)puVar1[1],new_prefix,1);
      }
    }
    return;
  }
  ly_log(pctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_xml.c",0xa5
        );
  return;
}

Assistant:

static void
xml_print_ns_prefix_data(struct xmlpr_ctx *pctx, LY_VALUE_FORMAT format, void *prefix_data, uint32_t prefix_opts)
{
    const struct ly_set *set;
    const struct lyxml_ns *ns;
    uint32_t i;

    switch (format) {
    case LY_VALUE_XML:
        set = prefix_data;
        for (i = 0; i < set->count; ++i) {
            ns = set->objs[i];
            if (!ns->prefix) {
                /* default namespace is not for the element */
                continue;
            }

            xml_print_ns(pctx, ns->uri, (prefix_opts & LYXML_PREFIX_DEFAULT) ? NULL : ns->prefix, prefix_opts);
        }
        break;
    default:
        /* cannot be created */
        LOGINT(pctx->ctx);
    }
}